

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  unsigned_long_long uVar5;
  BYTE *pBVar6;
  uint uVar7;
  U32 UVar8;
  int iVar9;
  U32 UVar10;
  size_t sVar11;
  ulong uVar12;
  BYTE *pBVar13;
  size_t code;
  uint uVar14;
  long lVar16;
  uint uVar17;
  int iVar18;
  ZSTD_CCtx_params *pZVar19;
  int *piVar20;
  undefined8 *puVar21;
  size_t srcSize_00;
  BYTE *ip;
  size_t sVar22;
  ZSTD_CCtx_params in_stack_ffffffffffffff08;
  size_t local_70;
  int iVar15;
  
  if (cctx->stage == ZSTDcs_created) {
    local_70 = 0xffffffffffffffc4;
  }
  else {
    if (cctx->stage == ZSTDcs_init && frame != 0) {
      uVar5 = cctx->pledgedSrcSizePlusOne;
      UVar8 = cctx->dictID;
      pZVar19 = &cctx->appliedParams;
      puVar21 = (undefined8 *)&stack0xffffffffffffff08;
      for (lVar16 = 0xf; lVar16 != 0; lVar16 = lVar16 + -1) {
        *puVar21 = *(undefined8 *)pZVar19;
        pZVar19 = (ZSTD_CCtx_params *)&(pZVar19->cParams).chainLog;
        puVar21 = puVar21 + 1;
      }
      sVar11 = ZSTD_writeFrameHeader(dst,dstCapacity,in_stack_ffffffffffffff08,uVar5 - 1,UVar8);
      uVar7 = ZSTD_isError(sVar11);
      if (uVar7 != 0) {
        return sVar11;
      }
      dstCapacity = dstCapacity - sVar11;
      dst = (void *)((long)dst + sVar11);
      cctx->stage = ZSTDcs_ongoing;
    }
    else {
      sVar11 = 0;
    }
    local_70 = sVar11;
    if (srcSize != 0) {
      pBVar6 = (cctx->blockState).matchState.window.nextSrc;
      if (pBVar6 == (BYTE *)src) {
        pBVar13 = (cctx->blockState).matchState.window.dictBase;
        uVar7 = (cctx->blockState).matchState.window.lowLimit;
        uVar12 = (ulong)(cctx->blockState).matchState.window.dictLimit;
      }
      else {
        pBVar13 = (cctx->blockState).matchState.window.base;
        uVar12 = (long)pBVar6 - (long)pBVar13;
        uVar7 = (cctx->blockState).matchState.window.dictLimit;
        (cctx->blockState).matchState.window.lowLimit = uVar7;
        uVar14 = (uint)uVar12;
        (cctx->blockState).matchState.window.dictLimit = uVar14;
        (cctx->blockState).matchState.window.dictBase = pBVar13;
        (cctx->blockState).matchState.window.base = (BYTE *)((long)src - uVar12);
        if (uVar14 - uVar7 < 8) {
          (cctx->blockState).matchState.window.lowLimit = uVar14;
          uVar7 = uVar14;
        }
      }
      pBVar2 = (BYTE *)((long)src + srcSize);
      (cctx->blockState).matchState.window.nextSrc = pBVar2;
      uVar14 = (uint)uVar12;
      if ((pBVar13 + uVar7 < pBVar2) && (src < pBVar13 + (uVar12 & 0xffffffff))) {
        uVar7 = (uint)((long)pBVar2 - (long)pBVar13);
        if ((long)(uVar12 & 0xffffffff) < (long)pBVar2 - (long)pBVar13) {
          uVar7 = uVar14;
        }
        (cctx->blockState).matchState.window.lowLimit = uVar7;
      }
      if (pBVar6 != (BYTE *)src) {
        (cctx->blockState).matchState.nextToUpdate = uVar14;
      }
      pBVar6 = (cctx->blockState).matchState.window.base;
      iVar18 = (int)pBVar6;
      if (0xe0000000 < (uint)((int)pBVar2 - iVar18)) {
        uVar17 = (int)src - iVar18;
        uVar17 = uVar17 - ((~(-1 << ((char)(cctx->appliedParams).cParams.chainLog -
                                     (ZSTD_lazy2 < (cctx->appliedParams).cParams.strategy) & 0x1fU))
                           & uVar17) + uVar7);
        (cctx->blockState).matchState.window.base = pBVar6 + uVar17;
        (cctx->blockState).matchState.window.dictBase = pBVar13 + uVar17;
        (cctx->blockState).matchState.window.lowLimit = uVar7 - uVar17;
        (cctx->blockState).matchState.window.dictLimit = uVar14 - uVar17;
        ZSTD_reduceIndex(cctx,uVar17);
        uVar7 = (cctx->blockState).matchState.nextToUpdate;
        UVar8 = uVar7 - uVar17;
        if (uVar7 < uVar17) {
          UVar8 = 0;
        }
        (cctx->blockState).matchState.nextToUpdate = UVar8;
        (cctx->blockState).matchState.loadedDictEnd = 0;
      }
      if ((cctx->appliedParams).ldmParams.enableLdm != 0) {
        pBVar6 = (cctx->ldmState).window.nextSrc;
        if (pBVar6 == (BYTE *)src) {
          pBVar13 = (cctx->ldmState).window.dictBase;
          uVar7 = (cctx->ldmState).window.lowLimit;
          uVar12 = (ulong)(cctx->ldmState).window.dictLimit;
        }
        else {
          pBVar13 = (cctx->ldmState).window.base;
          uVar12 = (long)pBVar6 - (long)pBVar13;
          uVar7 = (cctx->ldmState).window.dictLimit;
          (cctx->ldmState).window.lowLimit = uVar7;
          uVar14 = (uint)uVar12;
          (cctx->ldmState).window.dictLimit = uVar14;
          (cctx->ldmState).window.dictBase = pBVar13;
          (cctx->ldmState).window.base = (BYTE *)((long)src - uVar12);
          if (uVar14 - uVar7 < 8) {
            (cctx->ldmState).window.lowLimit = uVar14;
            uVar7 = uVar14;
          }
        }
        (cctx->ldmState).window.nextSrc = pBVar2;
        if ((pBVar13 + uVar7 < pBVar2) && (src < pBVar13 + (uVar12 & 0xffffffff))) {
          UVar8 = (U32)((long)pBVar2 - (long)pBVar13);
          if ((long)(uVar12 & 0xffffffff) < (long)pBVar2 - (long)pBVar13) {
            UVar8 = (U32)uVar12;
          }
          (cctx->ldmState).window.lowLimit = UVar8;
        }
      }
      if (frame == 0) {
        code = ZSTD_compressBlock_internal(cctx,dst,dstCapacity,src,srcSize);
      }
      else {
        iVar18 = 1 << ((byte)(cctx->appliedParams).cParams.windowLog & 0x1f);
        srcSize_00 = cctx->blockSize;
        if ((cctx->appliedParams).fParams.checksumFlag != 0) {
          XXH64_update(&cctx->xxhState,src,srcSize);
        }
        piVar20 = (int *)dst;
        sVar22 = srcSize;
        do {
          uVar7 = lastFrameChunk & 1;
          if (srcSize_00 < sVar22) {
            uVar7 = 0;
          }
          local_70 = 0xffffffffffffffba;
          code = local_70;
          if (dstCapacity < 6) goto LAB_00182b6d;
          if (sVar22 < srcSize_00) {
            srcSize_00 = sVar22;
          }
          pBVar6 = (cctx->blockState).matchState.window.base;
          iVar9 = (int)pBVar6;
          iVar15 = (int)(void *)((long)src + srcSize_00);
          uVar14 = iVar15 - iVar9;
          if (uVar14 < 0xe0000001) {
            UVar8 = (cctx->blockState).matchState.loadedDictEnd;
          }
          else {
            uVar17 = (int)src - iVar9;
            uVar17 = uVar17 - ((~(-1 << ((char)(cctx->appliedParams).cParams.chainLog -
                                         (ZSTD_lazy2 < (cctx->appliedParams).cParams.strategy) &
                                        0x1fU)) & uVar17) + iVar18);
            (cctx->blockState).matchState.window.base = pBVar6 + uVar17;
            ppBVar1 = &(cctx->blockState).matchState.window.dictBase;
            *ppBVar1 = *ppBVar1 + uVar17;
            uVar3 = (cctx->blockState).matchState.window.dictLimit;
            uVar4 = (cctx->blockState).matchState.window.lowLimit;
            (cctx->blockState).matchState.window.dictLimit = uVar3 - uVar17;
            (cctx->blockState).matchState.window.lowLimit = uVar4 - uVar17;
            ZSTD_reduceIndex(cctx,uVar17);
            uVar14 = (cctx->blockState).matchState.nextToUpdate;
            UVar8 = 0;
            UVar10 = uVar14 - uVar17;
            if (uVar14 < uVar17) {
              UVar10 = 0;
            }
            (cctx->blockState).matchState.nextToUpdate = UVar10;
            (cctx->blockState).matchState.loadedDictEnd = 0;
            uVar14 = iVar15 - *(int *)&(cctx->blockState).matchState.window.base;
          }
          uVar17 = (cctx->blockState).matchState.window.lowLimit;
          if (UVar8 + iVar18 < uVar14) {
            uVar14 = uVar14 - iVar18;
            if (uVar17 < uVar14) {
              (cctx->blockState).matchState.window.lowLimit = uVar14;
              uVar17 = uVar14;
            }
            if ((cctx->blockState).matchState.window.dictLimit < uVar17) {
              (cctx->blockState).matchState.window.dictLimit = uVar17;
            }
            (cctx->blockState).matchState.loadedDictEnd = 0;
          }
          if ((cctx->blockState).matchState.nextToUpdate < uVar17) {
            (cctx->blockState).matchState.nextToUpdate = uVar17;
          }
          code = ZSTD_compressBlock_internal
                           (cctx,(void *)((long)piVar20 + 3),dstCapacity - 3,src,srcSize_00);
          uVar14 = ZSTD_isError(code);
          if (uVar14 != 0) goto LAB_00182b6d;
          if (code == 0) {
            uVar12 = srcSize_00 + 3;
            code = local_70;
            if (dstCapacity < uVar12) goto LAB_00182b6d;
            *piVar20 = uVar7 + (int)srcSize_00 * 8;
            memcpy((void *)((long)piVar20 + 3),src,srcSize_00);
          }
          else {
            *(short *)piVar20 = (short)uVar7 + (short)code * 8 + 4;
            *(char *)((long)piVar20 + 2) = (char)(code >> 0xd);
            uVar12 = code + 3;
          }
          piVar20 = (int *)((long)piVar20 + uVar12);
          dstCapacity = dstCapacity - uVar12;
          sVar22 = sVar22 - srcSize_00;
          src = (void *)((long)src + srcSize_00);
        } while (sVar22 != 0);
        if ((lastFrameChunk != 0) && (dst < piVar20)) {
          cctx->stage = ZSTDcs_ending;
        }
        code = (long)piVar20 - (long)dst;
      }
LAB_00182b6d:
      local_70 = code;
      uVar7 = ZSTD_isError(local_70);
      if (uVar7 == 0) {
        uVar5 = cctx->consumedSrcSize;
        cctx->consumedSrcSize = uVar5 + srcSize;
        sVar11 = local_70 + sVar11;
        cctx->producedCSize = cctx->producedCSize + sVar11;
        local_70 = 0xffffffffffffffb8;
        if (uVar5 + srcSize + 1 <= cctx->pledgedSrcSizePlusOne) {
          local_70 = sVar11;
        }
        if (cctx->pledgedSrcSizePlusOne == 0) {
          local_70 = sVar11;
        }
      }
    }
  }
  return local_70;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (U32)srcSize);
    if (cctx->stage==ZSTDcs_created) return ERROR(stage_wrong);   /* missing init (ZSTD_compressBegin) */

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        if (ZSTD_isError(fhSize)) return fhSize;
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize)) {
        ms->nextToUpdate = ms->window.dictLimit;
    }

    // Added this: Fixes a crash after 4 GB of input data -cat
    if (ZSTD_window_needOverflowCorrection(ms->window, (char*)src + srcSize)) {
        U32 const cycleLog = ZSTD_cycleLog(cctx->appliedParams.cParams.chainLog, cctx->appliedParams.cParams.strategy);
        U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, ms->window.lowLimit, (char*)src);
        ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);

        ZSTD_reduceIndex(cctx, correction);
        if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
        else ms->nextToUpdate -= correction;
        ms->loadedDictEnd = 0;
    }

    if (cctx->appliedParams.ldmParams.enableLdm)
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize);

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (U32)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize);
        if (ZSTD_isError(cSize)) return cSize;
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            if (cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne) {
                DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                    (U32)cctx->pledgedSrcSizePlusOne-1, (U32)cctx->consumedSrcSize);
                return ERROR(srcSize_wrong);
            }
        }
        return cSize + fhSize;
    }
}